

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall
icu_63::RBBITableBuilder::sortedAdd(RBBITableBuilder *this,UVector **vector,int32_t val)

{
  int iVar1;
  int32_t iVar2;
  UVector *pUVar3;
  char cVar4;
  int index;
  int index_00;
  
  if (*vector == (UVector *)0x0) {
    pUVar3 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)vector);
    if (pUVar3 == (UVector *)0x0) {
      pUVar3 = (UVector *)0x0;
    }
    else {
      UVector::UVector(pUVar3,this->fStatus);
    }
    *vector = pUVar3;
  }
  pUVar3 = *vector;
  if ((pUVar3 == (UVector *)0x0) || (U_ZERO_ERROR < *this->fStatus)) {
    return;
  }
  iVar1 = pUVar3->count;
  index = 0;
  index_00 = index;
  if (0 < iVar1) {
    do {
      iVar2 = UVector::elementAti(pUVar3,index);
      cVar4 = (val < iVar2) * '\x02';
      if (iVar2 == val) {
        cVar4 = '\x01';
      }
      if (cVar4 != '\0') {
        index_00 = index;
        if (cVar4 != '\x02') {
          return;
        }
        break;
      }
      index = index + 1;
      index_00 = iVar1;
    } while (iVar1 != index);
  }
  UVector::insertElementAt(pUVar3,val,index_00,this->fStatus);
  return;
}

Assistant:

void RBBITableBuilder::sortedAdd(UVector **vector, int32_t val) {
    int32_t i;

    if (*vector == NULL) {
        *vector = new UVector(*fStatus);
    }
    if (*vector == NULL || U_FAILURE(*fStatus)) {
        return;
    }
    UVector *vec = *vector;
    int32_t  vSize = vec->size();
    for (i=0; i<vSize; i++) {
        int32_t valAtI = vec->elementAti(i);
        if (valAtI == val) {
            // The value is already in the vector.  Don't add it again.
            return;
        }
        if (valAtI > val) {
            break;
        }
    }
    vec->insertElementAt(val, i, *fStatus);
}